

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_util.cc
# Opt level: O3

bool libwebm::ParseVpxCodecPrivate(uint8_t *private_data,int32_t length,Vp9CodecFeatures *features)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  if (((length < 3) || (private_data == (uint8_t *)0x0)) || (features == (Vp9CodecFeatures *)0x0)) {
    return false;
  }
  features->profile = 0x7fffffff;
  features->level = 0x7fffffff;
  features->bit_depth = 0x7fffffff;
  features->chroma_subsampling = 0x7fffffff;
  uVar7 = 0x7fffffff;
  uVar3 = 0x7fffffff;
  uVar10 = 0x7fffffff;
  uVar4 = 0x7fffffff;
  uVar9 = 0x7fffffff;
  lVar6 = 0;
  while (private_data[lVar6 + 1] == '\x01') {
    switch(private_data[lVar6]) {
    case '\x01':
      bVar1 = private_data[lVar6 + 2];
      if (3 < bVar1) {
        return false;
      }
      if (uVar7 != 0x7fffffff && uVar7 != bVar1) {
        return false;
      }
      uVar7 = (uint)bVar1;
      features->profile = uVar7;
      bVar11 = true;
      break;
    case '\x02':
      bVar1 = private_data[lVar6 + 2];
      lVar2 = 0;
      do {
        if (*(uint *)((long)&DAT_001329a0 + lVar2) == (uint)bVar1) {
          if (uVar10 != 0x7fffffff && uVar10 != bVar1) {
            return false;
          }
          features->level = (uint)bVar1;
          uVar3 = (uint)bVar1;
          break;
        }
        lVar2 = lVar2 + 4;
      } while (lVar2 != 0x38);
      bVar11 = uVar3 != 0x7fffffff;
      uVar10 = uVar3;
      break;
    case '\x03':
      bVar1 = private_data[lVar6 + 2];
      if (0xc < bVar1) {
        return false;
      }
      if ((0x1500U >> (bVar1 & 0x1f) & 1) == 0) {
        return false;
      }
      uVar8 = (uint)bVar1;
      if (uVar4 != 0x7fffffff && uVar4 != uVar8) {
        return false;
      }
      features->bit_depth = uVar8;
      bVar11 = true;
      uVar4 = uVar8;
      break;
    case '\x04':
      bVar1 = private_data[lVar6 + 2];
      if (3 < bVar1) {
        return false;
      }
      if (uVar9 != 0x7fffffff && uVar9 != bVar1) {
        return false;
      }
      uVar9 = (uint)bVar1;
      features->chroma_subsampling = uVar9;
      bVar11 = true;
      break;
    default:
      goto LAB_0011a38b;
    }
    if (bVar11 == false) {
      return false;
    }
    iVar5 = (int)lVar6;
    lVar6 = lVar6 + 3;
    if (length < iVar5 + 6) {
      return bVar11;
    }
  }
LAB_0011a38b:
  return false;
}

Assistant:

bool ParseVpxCodecPrivate(const uint8_t* private_data, int32_t length,
                          Vp9CodecFeatures* features) {
  const int kVpxCodecPrivateMinLength = 3;
  if (!private_data || !features || length < kVpxCodecPrivateMinLength)
    return false;

  const uint8_t kVp9ProfileId = 1;
  const uint8_t kVp9LevelId = 2;
  const uint8_t kVp9BitDepthId = 3;
  const uint8_t kVp9ChromaSubsamplingId = 4;
  const int kVpxFeatureLength = 1;
  int offset = 0;

  // Set features to not set.
  features->profile = Vp9CodecFeatures::kValueNotPresent;
  features->level = Vp9CodecFeatures::kValueNotPresent;
  features->bit_depth = Vp9CodecFeatures::kValueNotPresent;
  features->chroma_subsampling = Vp9CodecFeatures::kValueNotPresent;
  do {
    const uint8_t id_byte = private_data[offset++];
    const uint8_t length_byte = private_data[offset++];
    if (length_byte != kVpxFeatureLength)
      return false;
    if (id_byte == kVp9ProfileId) {
      const int priv_profile = static_cast<int>(private_data[offset++]);
      if (priv_profile < 0 || priv_profile > 3)
        return false;
      if (features->profile != Vp9CodecFeatures::kValueNotPresent &&
          features->profile != priv_profile) {
        return false;
      }
      features->profile = priv_profile;
    } else if (id_byte == kVp9LevelId) {
      const int priv_level = static_cast<int>(private_data[offset++]);

      const int kNumLevels = 14;
      const int levels[kNumLevels] = {10, 11, 20, 21, 30, 31, 40,
                                      41, 50, 51, 52, 60, 61, 62};

      for (int i = 0; i < kNumLevels; ++i) {
        if (priv_level == levels[i]) {
          if (features->level != Vp9CodecFeatures::kValueNotPresent &&
              features->level != priv_level) {
            return false;
          }
          features->level = priv_level;
          break;
        }
      }
      if (features->level == Vp9CodecFeatures::kValueNotPresent)
        return false;
    } else if (id_byte == kVp9BitDepthId) {
      const int priv_profile = static_cast<int>(private_data[offset++]);
      if (priv_profile != 8 && priv_profile != 10 && priv_profile != 12)
        return false;
      if (features->bit_depth != Vp9CodecFeatures::kValueNotPresent &&
          features->bit_depth != priv_profile) {
        return false;
      }
      features->bit_depth = priv_profile;
    } else if (id_byte == kVp9ChromaSubsamplingId) {
      const int priv_profile = static_cast<int>(private_data[offset++]);
      if (priv_profile != 0 && priv_profile != 1 && priv_profile != 2 &&
          priv_profile != 3)
        return false;
      if (features->chroma_subsampling != Vp9CodecFeatures::kValueNotPresent &&
          features->chroma_subsampling != priv_profile) {
        return false;
      }
      features->chroma_subsampling = priv_profile;
    } else {
      // Invalid ID.
      return false;
    }
  } while (offset + kVpxCodecPrivateMinLength <= length);

  return true;
}